

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

double GetDifficulty(CBlockIndex *blockindex)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  double dVar4;
  
  uVar1 = blockindex->nBits;
  uVar3 = uVar1 >> 0x18;
  dVar4 = 65535.0 / (double)(uVar1 & 0xffffff);
  if (uVar1 < 0x1d000000) {
    iVar2 = uVar3 - 0x1d;
    do {
      dVar4 = dVar4 * 256.0;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0);
    uVar3 = 0x1d;
  }
  if (0x1d < uVar3) {
    iVar2 = uVar3 + 1;
    do {
      dVar4 = dVar4 * 0.00390625;
      iVar2 = iVar2 + -1;
    } while (0x1e < iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return dVar4;
  }
  __stack_chk_fail();
}

Assistant:

double GetDifficulty(const CBlockIndex& blockindex)
{
    int nShift = (blockindex.nBits >> 24) & 0xff;
    double dDiff =
        (double)0x0000ffff / (double)(blockindex.nBits & 0x00ffffff);

    while (nShift < 29)
    {
        dDiff *= 256.0;
        nShift++;
    }
    while (nShift > 29)
    {
        dDiff /= 256.0;
        nShift--;
    }

    return dDiff;
}